

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

Stream * rw::ps2::readNativeData
                   (Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  FILE *pFVar1;
  bool bVar2;
  uint32 uVar3;
  char *pcVar4;
  undefined4 *puVar5;
  void *pvVar6;
  undefined4 local_78 [2];
  uint32 buf [2];
  InstanceData *instance;
  Mesh *pMStack_60;
  uint32 i;
  Mesh *m;
  InstanceDataHeader *header;
  undefined4 local_48;
  Error _e_1;
  Error _e;
  uint32 platform;
  Geometry *geometry;
  int32 param_4_local;
  int32 param_3_local;
  void *object_local;
  int32 param_1_local;
  Stream *stream_local;
  
  bVar2 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar2) {
    uVar3 = Stream::readU32(stream);
    if (uVar3 == 4) {
      puVar5 = (undefined4 *)
               mustmalloc_LOC(0x10,0x3000f,
                              "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 94"
                             );
      *(undefined4 **)((long)object + 0x98) = puVar5;
      *puVar5 = 4;
      puVar5[1] = (uint)*(ushort *)(*(long *)((long)object + 0x90) + 4);
      pvVar6 = mustmalloc_LOC((ulong)(uint)puVar5[1] << 5,0x3000f,
                              "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 99"
                             );
      *(void **)(puVar5 + 2) = pvVar6;
      pMStack_60 = MeshHeader::getMeshes(*(MeshHeader **)((long)object + 0x90));
      for (instance._4_4_ = 0; stream_local = stream, instance._4_4_ < (uint)puVar5[1];
          instance._4_4_ = instance._4_4_ + 1) {
        buf = (uint32  [2])(*(long *)(puVar5 + 2) + (ulong)instance._4_4_ * 0x20);
        Stream::read32(stream,local_78,8);
        *(undefined4 *)buf = local_78[0];
        pvVar6 = mustmalloc_LOC((ulong)(*(int *)buf + 0x7f),0x3000f,
                                "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp line: 106"
                               );
        *(void **)((long)buf + 8) = pvVar6;
        *(ulong *)((long)buf + 0x10) = *(long *)((long)buf + 8) + 0x7fU & 0xffffffffffffff80;
        (*stream->_vptr_Stream[4])(stream,*(undefined8 *)((long)buf + 0x10),(ulong)*(uint *)buf);
        *(Material **)((long)buf + 0x18) = pMStack_60->material;
        pMStack_60 = pMStack_60 + 1;
      }
    }
    else {
      header._4_4_ = 2;
      local_48 = 0x80000006;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp"
              ,0x5b);
      pFVar1 = _stderr;
      pcVar4 = dbgsprint(0x80000006,(ulong)uVar3);
      fprintf(pFVar1,"%s\n",pcVar4);
      setError((Error *)((long)&header + 4));
      stream_local = (Stream *)0x0;
    }
  }
  else {
    _e_1.plugin = 2;
    _e_1.code = 0x80000004;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/ps2/ps2.cpp"
            ,0x56);
    pFVar1 = _stderr;
    pcVar4 = dbgsprint(0x80000004,"STRUCT");
    fprintf(pFVar1,"%s\n",pcVar4);
    setError(&_e_1);
    stream_local = (Stream *)0x0;
  }
  return stream_local;
}

Assistant:

Stream*
readNativeData(Stream *stream, int32, void *object, int32, int32)
{
	ASSERTLITTLE;
	Geometry *geometry = (Geometry*)object;
	uint32 platform;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		return nil;
	}
	platform = stream->readU32();
	if(platform != PLATFORM_PS2){
		RWERROR((ERR_PLATFORM, platform));
		return nil;
	}
	InstanceDataHeader *header = rwNewT(InstanceDataHeader, 1, MEMDUR_EVENT | ID_GEOMETRY);
	geometry->instData = header;
	header->platform = PLATFORM_PS2;
	assert(geometry->meshHeader != nil);
	header->numMeshes = geometry->meshHeader->numMeshes;
	header->instanceMeshes = rwNewT(InstanceData, header->numMeshes, MEMDUR_EVENT | ID_GEOMETRY);
	Mesh *m = geometry->meshHeader->getMeshes();
	for(uint32 i = 0; i < header->numMeshes; i++){
		InstanceData *instance = &header->instanceMeshes[i];
		uint32 buf[2];
		stream->read32(buf, 8);
		instance->dataSize = buf[0];
		instance->dataRaw = rwNewT(uint8, instance->dataSize+0x7F, MEMDUR_EVENT | ID_GEOMETRY);
		instance->data = ALIGNPTR(instance->dataRaw, 0x80);
#ifdef RW_PS2
		uint32 a = (uint32)instance->data;
		assert(a % 0x10 == 0);
#endif
		stream->read8(instance->data, instance->dataSize);
#ifdef RW_PS2
		if(!buf[1])
			fixDmaOffsets(instance);
#endif
		instance->material = m->material;
//		sizedebug(instance);
		m++;
	}
	return stream;
}